

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall
Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (Sudoku *this,FieldVector *testFields,int chooseFieldThatHasNPossibilities,
          bool fixFieldChooseRandomly,bool debug)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  undefined3 in_register_00000009;
  pointer psVar7;
  int local_48;
  int local_44;
  
  iVar4 = (int)((ulong)((long)(testFields->
                              super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(testFields->
                             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (CONCAT31(in_register_00000009,fixFieldChooseRandomly) == 0) {
    local_44 = 0;
    local_48 = 0;
    do {
      iVar2 = rand();
      iVar2 = iVar2 % iVar4;
      psVar7 = (testFields->
               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      iVar3 = Field::value(psVar7[iVar2].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      if (iVar3 == 0) {
        psVar7 = psVar7 + iVar2;
        iVar3 = Field::n_possible((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
        if (iVar3 != chooseFieldThatHasNPossibilities) goto LAB_0010dcfd;
        local_48 = Field::pos_x((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
        local_44 = Field::pos_y((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
        bVar1 = true;
      }
      else {
LAB_0010dcfd:
        bVar1 = false;
      }
    } while (!bVar1);
  }
  else {
    do {
      iVar2 = rand();
      iVar2 = iVar2 % iVar4;
      iVar3 = Field::value((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[iVar2].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (iVar3 != 0);
    local_48 = Field::pos_x((testFields->
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[iVar2].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_44 = Field::pos_y((testFields->
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[iVar2].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  iVar4 = Field::value((this->field_begin_)._M_current[iVar2].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Field::setValue((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar4);
  Field::setFixed((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (!debug) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fix field (",0xb);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") (index ",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") to value ",0xb);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", fixFieldChooseRandomly=",0x19);
  plVar6 = (long *)std::ostream::operator<<(poVar5,(uint)fixFieldChooseRandomly);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  return;
}

Assistant:

void Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution(FieldVector &testFields, int chooseFieldThatHasNPossibilities, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int index = 0;

  int nTestFields = testFields.size();

  // choose field coordinates (posXtoFix, posYtoFix) that gets fixed afterwards
  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      // choose a random field and check if it is not already set
      index = rand() % nTestFields;
      if(testFields[index]->value() == 0)
      {
        // store these coordinates
        posXtoFix = testFields[index]->pos_x();
        posYtoFix = testFields[index]->pos_y();

        //std::cout<<"r"<<testFields[index]->n_possible()<<" ";
        break;
      }
    }
  }
  else    // do not choose completely randomly
  {
    //take the first field that has the given number of posibilities
    //for(index = 0; index < testFields.size(); index++)

    //take a random field that has the given number of posibilities
    while(true)
    {
      index = rand() % nTestFields;
      std::shared_ptr<Field> &testField = testFields[index];

      if(testField->value() != 0)
        continue;

      if(testField->n_possible() == chooseFieldThatHasNPossibilities)
      {
        //std::cout<<"a"<<testFields[index]->n_possible()<<" ";
        posXtoFix = testField->pos_x();
        posYtoFix = testField->pos_y();
        break;
      }
    }
  }

  //int correctValue = fields_[index]->value();   // select correct value from solved sudoku
  int correctValue = (*(field_begin_+index))->value();   // select correct value from solved sudoku

  testFields[index]->setValue(correctValue);
  testFields[index]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<") (index "<<index<<") to value "<<correctValue<<", fixFieldChooseRandomly="<<int(fixFieldChooseRandomly)<<std::endl;
}